

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int run_container_rank(run_container_t *container,uint16_t x)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t x32;
  uint uVar6;
  undefined6 in_register_00000032;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)container->n_runs;
  if (container->n_runs < 1) {
    uVar4 = uVar5;
  }
  iVar3 = 0;
  while( true ) {
    if (uVar4 == uVar5) {
      return iVar3;
    }
    uVar1 = container->runs[uVar5].value;
    uVar2 = container->runs[uVar5].length;
    uVar6 = (uint)CONCAT62(in_register_00000032,x);
    if (uVar6 <= (uint)uVar2 + (uint)uVar1) break;
    iVar3 = iVar3 + (uint)uVar2 + 1;
    uVar5 = uVar5 + 1;
  }
  if (x < uVar1) {
    return iVar3;
  }
  return ((uVar6 + iVar3) - (uint)uVar1) + 1;
}

Assistant:

int run_container_rank(const run_container_t *container, uint16_t x) {
    int sum = 0;
    uint32_t x32 = x;
    for (int i = 0; i < container->n_runs; i++) {
        uint32_t startpoint = container->runs[i].value;
        uint32_t length = container->runs[i].length;
        uint32_t endpoint = length + startpoint;
        if (x <= endpoint) {
            if (x < startpoint) break;
            return sum + (x32 - startpoint) + 1;
        } else {
            sum += length + 1;
        }
    }
    return sum;
}